

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall
TTD::ThreadContextTTD::AddNewScriptContextReplay
          (ThreadContextTTD *this,FinalizableObject *externalCtx,ScriptContext *ctx,
          HostScriptContextCallbackFunctor *callbackFunctor,bool noNative,bool debugMode)

{
  FinalizableObject *local_30;
  FinalizableObject *externalCtx_local;
  ScriptContext *ctx_local;
  
  local_30 = externalCtx;
  externalCtx_local = (FinalizableObject *)ctx;
  AddNewScriptContext_Helper(this,ctx,callbackFunctor,noNative,debugMode);
  this->m_contextCreatedOrDestoyedInReplay = true;
  Memory::Recycler::RootAddRef(this->m_threadCtx->recycler,local_30,(uint *)0x0);
  JsUtil::
  BaseDictionary<Js::ScriptContext*,FinalizableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::ScriptContext*,FinalizableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::ScriptContext*,FinalizableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdContextToExternalRefMap,(ScriptContext **)&externalCtx_local,&local_30);
  return;
}

Assistant:

void ThreadContextTTD::AddNewScriptContextReplay(FinalizableObject* externalCtx, Js::ScriptContext* ctx, HostScriptContextCallbackFunctor& callbackFunctor, bool noNative, bool debugMode)
    {
        this->AddNewScriptContext_Helper(ctx, callbackFunctor, noNative, debugMode);

        this->m_contextCreatedOrDestoyedInReplay = true;

        this->m_threadCtx->GetRecycler()->RootAddRef(externalCtx);
        this->m_ttdContextToExternalRefMap.Add(ctx, externalCtx);
    }